

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMeshControl.cpp
# Opt level: O2

TPZCompMesh * __thiscall TPZMHMeshControl::CriaMalhaTemporaria(TPZMHMeshControl *this)

{
  int dim;
  TPZGeoMesh *pTVar1;
  TPZGeoEl *pTVar2;
  int iVar3;
  int iVar4;
  TPZGeoEl **ppTVar5;
  iterator iVar6;
  TPZCompMesh *this_00;
  TPZL2Projection<double> *this_01;
  _Base_ptr p_Var7;
  TPZBndCond *mat;
  iterator iVar8;
  int iVar9;
  TPZCreateApproximationSpace *this_02;
  int iVar10;
  _Self __tmp_1;
  _Self __tmp;
  TPZL2Projection<double> *pTVar11;
  int materialid;
  undefined4 uStack_1b4;
  int local_1ac;
  _Base_ptr local_1a8;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *local_1a0;
  TPZChunkVector<TPZGeoEl_*,_10> *local_198;
  long local_190;
  _func_int **local_188;
  TPZVec<double> val2;
  int matid;
  undefined4 uStack_15c;
  TPZGeoEl *local_158;
  int local_150;
  TPZManVector<double,_1> sol;
  set<int,_std::less<int>,_std::allocator<int>_> bcids;
  set<int,_std::less<int>,_std::allocator<int>_> matids;
  TPZGeoElSide gelside;
  
  TPZGeoMesh::ResetReference(((this->fGMesh).fRef)->fPointer);
  pTVar1 = ((this->fGMesh).fRef)->fPointer;
  dim = pTVar1->fDim;
  matids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &matids._M_t._M_impl.super__Rb_tree_header._M_header;
  matids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  matids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  matids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bcids._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bcids._M_t._M_impl.super__Rb_tree_header._M_header;
  bcids._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bcids._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bcids._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190 = (pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
  local_198 = &(pTVar1->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>;
  local_1a0 = &this->fMHMtoSubCMesh;
  local_1a8 = &(this->fMHMtoSubCMesh)._M_t._M_impl.super__Rb_tree_header._M_header;
  iVar9 = dim + -1;
  local_188 = (_func_int **)&PTR__TPZGeoElSide_0172da80;
  bcids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bcids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  matids._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       matids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (_matid = (_func_int **)0x0; (long)_matid < local_190; _matid = _matid + 1) {
    ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_198,(int64_t)_matid);
    pTVar2 = *ppTVar5;
    if (((pTVar2 != (TPZGeoEl *)0x0) &&
        (iVar3 = (**(code **)(*(long *)pTVar2 + 0x210))(pTVar2), iVar3 == dim)) &&
       (iVar6 = std::
                _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                ::find(&local_1a0->_M_t,(key_type_conflict1 *)&matid), iVar6._M_node != local_1a8))
    {
      _materialid = CONCAT44(uStack_1b4,pTVar2->fMatId);
      std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
      _M_insert_unique<int_const&>
                ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)&matids
                 ,&materialid);
      iVar3 = (**(code **)(*(long *)pTVar2 + 0xf0))(pTVar2);
      iVar10 = 0;
      if (iVar3 < 1) {
        iVar3 = iVar10;
      }
      for (; iVar10 != iVar3; iVar10 = iVar10 + 1) {
        iVar4 = (**(code **)(*(long *)pTVar2 + 0x208))(pTVar2,iVar10);
        if (iVar4 == iVar9) {
          gelside.super_TPZSavable._vptr_TPZSavable = local_188;
          gelside.fGeoEl = pTVar2;
          gelside.fSide = iVar10;
          TPZGeoElSide::Neighbour((TPZGeoElSide *)&sol,&gelside);
          while (((TPZGeoEl *)sol.super_TPZVec<double>.fStore != gelside.fGeoEl ||
                 ((int)sol.super_TPZVec<double>.fNElements != gelside.fSide))) {
            iVar4 = (**(code **)((long)*sol.super_TPZVec<double>.fStore + 0x210))();
            if (iVar4 == iVar9) {
              val2._vptr_TPZVec =
                   (_func_int **)
                   CONCAT44(val2._vptr_TPZVec._4_4_,
                            *(undefined4 *)(sol.super_TPZVec<double>.fStore + 3));
              std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              _M_insert_unique<int>(&bcids._M_t,(int *)&val2);
            }
            TPZGeoElSide::Neighbour((TPZGeoElSide *)&val2,(TPZGeoElSide *)&sol);
            sol.super_TPZVec<double>.fStore = val2.fStore;
            sol.super_TPZVec<double>.fNElements._0_4_ = (int)val2.fNElements;
          }
        }
      }
    }
  }
  this_00 = (TPZCompMesh *)operator_new(0x918);
  TPZCompMesh::TPZCompMesh(this_00,&this->fGMesh,false);
  this_00->fDimModel = dim;
  gelside.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZManVector<double,_1>::TPZManVector(&sol,1,(double *)&gelside);
  pTVar11 = (TPZL2Projection<double> *)0x0;
  for (p_Var7 = matids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != &matids._M_t._M_impl.super__Rb_tree_header;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    this_01 = (TPZL2Projection<double> *)operator_new(0xb0);
    TPZL2Projection<double>::TPZL2Projection
              (this_01,p_Var7[1]._M_color,dim,1,&sol.super_TPZVec<double>);
    TPZCompMesh::InsertMaterialObject(this_00,(TPZMaterial *)this_01);
    if (pTVar11 == (TPZL2Projection<double> *)0x0) {
      pTVar11 = this_01;
    }
  }
  if (pTVar11 != (TPZL2Projection<double> *)0x0) {
    p_Var7 = bcids._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while ((_Rb_tree_header *)p_Var7 != &bcids._M_t._M_impl.super__Rb_tree_header) {
      val2._vptr_TPZVec = (_func_int **)0x0;
      TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)&gelside,2,2,(double *)&val2);
      _matid = (_func_int **)0x0;
      TPZVec<double>::TPZVec(&val2,2,(double *)&matid);
      mat = (TPZBndCond *)
            (**(code **)(*(long *)pTVar11 + 0xb8))
                      (pTVar11,pTVar11,p_Var7[1]._M_color,0,&gelside,&val2);
      TPZCompMesh::InsertMaterialObject(this_00,mat);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      TPZVec<double>::~TPZVec(&val2);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)&gelside);
    }
    this_02 = &this_00->fCreate;
    TPZCreateApproximationSpace::SetAllCreateFunctionsDiscontinuous(this_02);
    for (_materialid = 0; _materialid < local_190; _materialid = _materialid + 1) {
      ppTVar5 = TPZChunkVector<TPZGeoEl_*,_10>::operator[](local_198,_materialid);
      pTVar2 = *ppTVar5;
      if (((pTVar2 != (TPZGeoEl *)0x0) &&
          (iVar3 = (**(code **)(*(long *)pTVar2 + 0x210))(), iVar3 == dim)) &&
         (iVar6 = std::
                  _Rb_tree<long,_std::pair<const_long,_long>,_std::_Select1st<std::pair<const_long,_long>_>,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                  ::find(&local_1a0->_M_t,(key_type_conflict1 *)&materialid),
         iVar6._M_node != local_1a8)) {
        TPZCreateApproximationSpace::CreateCompEl(this_02,pTVar2,this_00);
        local_1ac = (**(code **)(*(long *)pTVar2 + 0xf0))();
        iVar3 = 0;
        if (local_1ac < 1) {
          local_1ac = iVar3;
        }
        for (; iVar3 != local_1ac; iVar3 = iVar3 + 1) {
          iVar10 = (**(code **)(*(long *)pTVar2 + 0x208))(pTVar2,iVar3);
          if (iVar10 == iVar9) {
            gelside.super_TPZSavable._vptr_TPZSavable = local_188;
            gelside.fGeoEl = pTVar2;
            gelside.fSide = iVar3;
            TPZGeoElSide::Neighbour((TPZGeoElSide *)&val2,&gelside);
            while (((TPZGeoEl *)val2.fStore != gelside.fGeoEl ||
                   ((int)val2.fNElements != gelside.fSide))) {
              iVar10 = (**(code **)((long)*val2.fStore + 0x210))();
              if (iVar10 == iVar9) {
                matid = *(undefined4 *)(val2.fStore + 3);
                iVar8 = std::
                        _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                        ::find(&bcids._M_t,(key_type *)&matid);
                if ((_Rb_tree_header *)iVar8._M_node != &bcids._M_t._M_impl.super__Rb_tree_header) {
                  TPZCreateApproximationSpace::CreateCompEl(this_02,(TPZGeoEl *)val2.fStore,this_00)
                  ;
                }
              }
              TPZGeoElSide::Neighbour((TPZGeoElSide *)&matid,(TPZGeoElSide *)&val2);
              val2.fStore = (double *)local_158;
              val2.fNElements._0_4_ = local_150;
            }
          }
        }
      }
    }
    TPZCreateApproximationSpace::CreateInterfaces(this_00);
    (**(code **)(*(long *)this_00 + 0x60))(this_00);
    TPZManVector<double,_1>::~TPZManVector(&sol);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&bcids._M_t);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&matids._M_t);
    return this_00;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZMHMeshControl.cpp"
             ,0x211);
}

Assistant:

TPZCompMesh* TPZMHMeshControl::CriaMalhaTemporaria()
{
    fGMesh->ResetReference();
	/// criar materiais
	int dim = fGMesh->Dimension();
    std::set<int> matids, bcids;
    TPZGeoMesh &gmesh = fGMesh;
    int64_t nel = gmesh.NElements();
    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        int materialid = gel->MaterialId();
        matids.insert(materialid);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    bcids.insert(neighbour.Element()->MaterialId());
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCompMesh *cmesh = new TPZCompMesh(fGMesh);
	cmesh->SetDimModel(dim);
    TPZManVector<STATE,1> sol(1,0.);
    int nstate = 1;
    std::set<int>::iterator it = matids.begin();
    TPZMaterialT<STATE> *meshmat = nullptr;
    while (it != matids.end()) {
        TPZL2Projection<STATE> *material = new TPZL2Projection(*it,dim,nstate,sol);
        cmesh->InsertMaterialObject(material);
        if (!meshmat) {
            meshmat = material;
        }
        it++;

    }

    if (!meshmat) {
        DebugStop();
    }

	it = bcids.begin();
    while (it != bcids.end()) {
        ///Inserir condicao de contorno
        TPZFMatrix<STATE> val1(2,2,0.);
        TPZVec<STATE> val2(2,0.);

        TPZBndCond * BCondD1 = meshmat->CreateBC(meshmat, *it,0, val1, val2);
        cmesh->InsertMaterialObject(BCondD1);

        it++;
    }

    cmesh->SetAllCreateFunctionsDiscontinuous();
    TPZCreateApproximationSpace &create = cmesh->ApproxSpace();

    for (int64_t el=0; el<nel; el++) {
        TPZGeoEl *gel = gmesh.ElementVec()[el];
        if (!gel) {
            continue;
        }
        if (gel->Dimension() != dim || fMHMtoSubCMesh.find(el) == fMHMtoSubCMesh.end()) {
            continue;
        }
        create.CreateCompEl(gel, *cmesh);
        int ns = gel->NSides();
        for (int is=0; is<ns; is++) {
            if (gel->SideDimension(is) != dim-1) {
                continue;
            }
            TPZGeoElSide gelside(gel,is);
            TPZGeoElSide neighbour = gelside.Neighbour();
            while (neighbour != gelside) {
                if (neighbour.Element()->Dimension() == dim-1) {
                    int matid = neighbour.Element()->MaterialId();
                    if (bcids.find(matid) != bcids.end()) {
                        create.CreateCompEl(neighbour.Element(), *cmesh);
                    }
                }
                neighbour = neighbour.Neighbour();
            }
        }
    }

    TPZCreateApproximationSpace::CreateInterfaces(*cmesh);
    cmesh->ExpandSolution();
    return cmesh;
}